

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void * phmap::priv::
       Allocate<8ul,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
                 (scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
                  *alloc,size_t n)

{
  unsigned_long uVar1;
  void *pvVar2;
  A mem_alloc;
  offset_ptr_internal<unsigned_long,_0UL> local_30 [2];
  long local_20 [2];
  
  if (n != 0) {
    uVar1 = (alloc->
            super_allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
            ).mp_mngr.internal.m_offset;
    pvVar2 = (void *)((long)&(alloc->
                             super_allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                             ).mp_mngr.internal + uVar1);
    if (uVar1 == 1) {
      pvVar2 = (void *)0x0;
    }
    local_20[0] = 1;
    if (pvVar2 != (void *)0x0) {
      local_20[0] = (long)pvVar2 - (long)local_20;
    }
    local_30[1] = (offset_ptr_internal<unsigned_long,_0UL>)0x1;
    boost::interprocess::
    allocator<M,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
    ::allocate((allocator<M,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                *)local_30,(size_type)local_20,(cvoid_ptr *)(n + 7 >> 3));
    pvVar2 = (void *)((long)local_30 + local_30[0].m_offset);
    if (local_30[0].m_offset == 1) {
      pvVar2 = (void *)0x0;
    }
    return pvVar2;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x105d,
                "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const unsigned long, std::vector<unsigned long, boost::interprocess::allocator<unsigned long, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>]"
               );
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = &*AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M)); // `&*` to support custom pointers such as boost offset_ptr.
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}